

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyParseOptGroup(TidyDocImpl *doc,Node *field,GetTokenMode mode)

{
  TidyTagId TVar1;
  Lexer *pLVar2;
  Bool BVar3;
  Node *node;
  TidyParserMemory memory;
  Node *pNStack_40;
  
  pLVar2 = doc->lexer;
  if (field == (Node *)0x0) {
    prvTidypopMemory(doc);
    field = pNStack_40;
  }
  pLVar2->insert = (IStack *)0x0;
  do {
    do {
      node = prvTidyGetToken(doc,IgnoreWhitespace);
      if (node == (Node *)0x0) {
        return (Node *)0x0;
      }
      if ((node->tag == field->tag) && (node->type == EndTag)) {
        prvTidyFreeNode(doc,node);
        field->closed = yes;
        TrimSpaces(doc,field);
        return (Node *)0x0;
      }
      BVar3 = InsertMisc(field,node);
    } while (BVar3 != no);
    if ((node->type == StartTag) && (node->tag != (Dict *)0x0)) {
      TVar1 = node->tag->id;
      if (TVar1 == TidyTag_OPTGROUP) {
        prvTidyReport(doc,field,node,0x231);
LAB_0013c7d0:
        prvTidyInsertNodeAtEnd(field,node);
        prvTidypushMemory(doc,(TidyParserMemory)
                              ZEXT2448(CONCAT816(node,CONCAT88(field,prvTidyParseOptGroup))));
        return node;
      }
      if (TVar1 == TidyTag_OPTION) goto LAB_0013c7d0;
    }
    prvTidyReport(doc,field,node,0x235);
    prvTidyFreeNode(doc,node);
  } while( true );
}

Assistant:

Node* TY_(ParseOptGroup)( TidyDocImpl* doc, Node *field, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    DEBUG_LOG_COUNTERS;
    
    if ( field == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        field = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(field);
    }
    
    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == field->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            field->closed = yes;
            TrimSpaces(doc, field);
            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(field, node))
            continue;

        if ( node->type == StartTag &&
             (nodeIsOPTION(node) || nodeIsOPTGROUP(node)) )
        {
            TidyParserMemory memory = {0};

            if ( nodeIsOPTGROUP(node) )
                TY_(Report)(doc, field, node, CANT_BE_NESTED);

            TY_(InsertNodeAtEnd)(field, node);

            memory.identity = TY_(ParseOptGroup);
            memory.original_node = field;
            memory.reentry_node = node;
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, field, node, DISCARDING_UNEXPECTED );
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG_EXIT;
    return NULL;
}